

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O3

int ProjectBissectionInParametricDomain<pzgeom::TPZQuadraticTrig>
              (TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  TPZVec<double> *this;
  int sideto;
  double dVar6;
  double dVar7;
  TPZVec<double> InnPt;
  TPZVec<double> OutPt;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  TPZTransform<double> T2;
  TPZTransform<double> T1;
  TPZVec<double> local_428;
  double local_408;
  TPZVec<double> local_400;
  TPZManVector<double,_3> local_3e0;
  TPZManVector<double,_3> local_3a8;
  TPZTransform<double> local_370;
  TPZTransform<double> local_1d0;
  
  (*qsiInDomain->_vptr_TPZVec[3])(qsiInDomain,2);
  bVar2 = pztopology::TPZTriangle::IsInParametricDomain(qsi,0.0);
  if (bVar2) {
    TPZVec<double>::operator=(qsiInDomain,qsi);
    return 6;
  }
  TPZVec<double>::TPZVec(&local_400,qsi);
  TPZVec<double>::TPZVec(&local_428,2);
  pztopology::TPZTriangle::CenterPoint(6,&local_428);
  dVar6 = 0.0;
  lVar5 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    dVar6 = dVar6 + (local_428.fStore[lVar5] - local_400.fStore[lVar5]) *
                    (local_428.fStore[lVar5] - local_400.fStore[lVar5]);
    lVar5 = 1;
    bVar2 = false;
  } while (bVar3);
  if (0.0 <= dVar6) goto LAB_00f513ac;
  do {
    dVar6 = sqrt(dVar6);
    while( true ) {
      if (dVar6 <= 1e-10) {
        TPZManVector<double,_3>::TPZManVector(&local_3a8,2);
        TPZManVector<double,_3>::TPZManVector(&local_3e0,2);
        iVar4 = -1;
        sideto = 0;
        do {
          pztopology::TPZTriangle::SideToSideTransform(&local_1d0,6,sideto);
          TPZTransform<double>::Apply(&local_1d0,qsiInDomain,&local_3a8.super_TPZVec<double>);
          pztopology::TPZTriangle::SideToSideTransform(&local_370,sideto,6);
          TPZTransform<double>::Apply
                    (&local_370,&local_3a8.super_TPZVec<double>,&local_3e0.super_TPZVec<double>);
          dVar6 = 0.0;
          lVar5 = 0;
          bVar2 = true;
          do {
            bVar3 = bVar2;
            dVar7 = qsiInDomain->fStore[lVar5] - local_3e0.super_TPZVec<double>.fStore[lVar5];
            dVar6 = dVar6 + dVar7 * dVar7;
            lVar5 = 1;
            bVar2 = false;
          } while (bVar3);
          if (dVar6 < 0.0) {
            local_408 = sqrt(dVar6);
          }
          else {
            local_408 = SQRT(dVar6);
          }
          if (local_408 < 1e-10) {
            TPZVec<double>::operator=(qsiInDomain,&local_3e0.super_TPZVec<double>);
            iVar4 = sideto;
          }
          TPZTransform<double>::~TPZTransform(&local_370);
          TPZTransform<double>::~TPZTransform(&local_1d0);
        } while ((1e-10 <= local_408) && (sideto = sideto + 1, sideto != 6));
        TPZManVector<double,_3>::~TPZManVector(&local_3e0);
        TPZManVector<double,_3>::~TPZManVector(&local_3a8);
        local_428._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_428.fStore != (double *)0x0) {
          operator_delete__(local_428.fStore);
        }
        local_400._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_400.fStore == (double *)0x0) {
          return iVar4;
        }
        operator_delete__(local_400.fStore);
        return iVar4;
      }
      pdVar1 = qsiInDomain->fStore;
      *pdVar1 = (*local_428.fStore + *local_400.fStore) * 0.5;
      pdVar1[1] = (local_428.fStore[1] + local_400.fStore[1]) * 0.5;
      bVar2 = pztopology::TPZTriangle::IsInParametricDomain(qsiInDomain,0.0);
      this = &local_400;
      if (bVar2) {
        this = &local_428;
      }
      TPZVec<double>::operator=(this,qsiInDomain);
      dVar6 = 0.0;
      lVar5 = 0;
      bVar2 = true;
      do {
        bVar3 = bVar2;
        dVar6 = dVar6 + (local_428.fStore[lVar5] - local_400.fStore[lVar5]) *
                        (local_428.fStore[lVar5] - local_400.fStore[lVar5]);
        lVar5 = 1;
        bVar2 = false;
      } while (bVar3);
      if (dVar6 < 0.0) break;
LAB_00f513ac:
      dVar6 = SQRT(dVar6);
    }
  } while( true );
}

Assistant:

int ProjectBissectionInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    const int dim = Topology::Dimension;
    
    qsiInDomain.Resize(dim);
    
    if(Topology::IsInParametricDomain(qsi,0.))///it is already in the domain
    {
        qsiInDomain = qsi;
        return nsides-1;
    }
    
    REAL tol = 1.e-10;
    
    ///first, will be made a project to center direction
    TPZVec<REAL> OutPt(qsi), InnPt(dim);
    Topology::CenterPoint(nsides-1,InnPt);
    
    REAL dist = 0.;
    for(int c = 0; c < dim; c++)
    {
        dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
    }
    dist = sqrt(dist);
    
    while(dist > tol)
    {
        for(int c = 0; c < dim; c++)
        {
            qsiInDomain[c] = (InnPt[c] + OutPt[c])/2.;
        }
        if(Topology::IsInParametricDomain(qsiInDomain,0.))
        {
            InnPt = qsiInDomain;
        }
        else
        {
            OutPt = qsiInDomain;
        }
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
        }
        dist = sqrt(dist);
    }
    
    ///found in witch side the projection belongs
    int winnerSide = -1;
    TPZManVector<REAL,3> pt1(dim), pt2(dim);
    for(int is = 0; is < nsides-1; is++)
    {
        ///Go orthogonally from \f$ NSides-1 \f$ to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        T1.Apply(qsiInDomain,pt1);
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare ptInDomain to transformed point
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (qsiInDomain[c]-pt2[c]) * (qsiInDomain[c]-pt2[c]);
        }//i
        dist = sqrt(dist);
        
        ///Closest side
        if(dist < tol)
        {
            winnerSide = is;
            qsiInDomain = pt2;
            break;
        }
    }//for is
    
    return winnerSide;
    
}